

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_mean(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  void *pvVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  float fVar19;
  ggml_tensor *src0;
  long local_68;
  long local_60;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x818,"fatal error");
  }
  if ((params->ith == 0) && (lVar2 = pgVar1->ne[3], 0 < lVar2)) {
    lVar3 = pgVar1->ne[1];
    lVar4 = pgVar1->ne[2];
    sVar5 = pgVar1->nb[1];
    sVar6 = pgVar1->nb[2];
    sVar7 = pgVar1->nb[3];
    sVar8 = dst->nb[1];
    sVar9 = dst->nb[2];
    sVar10 = dst->nb[3];
    lVar11 = pgVar1->ne[0];
    uVar18 = (uint)lVar11;
    local_60 = 0;
    local_68 = 0;
    do {
      if (0 < lVar4) {
        lVar15 = 0;
        lVar16 = local_60;
        do {
          if (0 < lVar3) {
            pvVar12 = dst->data;
            lVar17 = (long)pgVar1->data + lVar16;
            lVar13 = 0;
            do {
              if ((int)uVar18 < 1) {
                fVar19 = 0.0;
              }
              else {
                fVar19 = 0.0;
                uVar14 = 0;
                do {
                  fVar19 = fVar19 + *(float *)(lVar17 + uVar14 * 4);
                  uVar14 = uVar14 + 1;
                } while ((uVar18 & 0x7fffffff) != uVar14);
              }
              *(float *)((long)pvVar12 + lVar13 * sVar8 + local_68 * sVar10 + lVar15 * sVar9) =
                   fVar19 / (float)lVar11;
              lVar13 = lVar13 + 1;
              lVar17 = lVar17 + sVar5;
            } while (lVar13 != lVar3);
          }
          lVar15 = lVar15 + 1;
          lVar16 = lVar16 + sVar6;
        } while (lVar15 != lVar4);
      }
      local_68 = local_68 + 1;
      local_60 = local_60 + sVar7;
    } while (local_68 != lVar2);
  }
  return;
}

Assistant:

void ggml_compute_forward_mean(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_mean_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}